

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

void * ffi_checkptr(lua_State *L,int narg,CTypeID id)

{
  lua_State *L_00;
  int in_ESI;
  long in_RDI;
  void *p;
  TValue *o;
  CTState *cts;
  CTState *cts_1;
  ErrMsg in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  
  *(long *)((ulong)*(uint *)((ulong)*(uint *)(in_RDI + 8) + 0xfc) + 0x10) = in_RDI;
  L_00 = (lua_State *)(*(long *)(in_RDI + 0x10) + (long)in_ESI * 8 + -8);
  if (*(lua_State **)(in_RDI + 0x18) <= L_00) {
    lj_err_arg(L_00,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
  }
  lj_cconv_ct_tv((CTState *)CONCAT44(narg,id),(CType *)cts,(uint8_t *)&o->u64,(TValue *)p,
                 (CTInfo)((ulong)in_RDI >> 0x20));
  return (void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
}

Assistant:

static void *ffi_checkptr(lua_State *L, int narg, CTypeID id)
{
  CTState *cts = ctype_cts(L);
  TValue *o = L->base + narg-1;
  void *p;
  if (o >= L->top)
    lj_err_arg(L, narg, LJ_ERR_NOVAL);
  lj_cconv_ct_tv(cts, ctype_get(cts, id), (uint8_t *)&p, o, CCF_ARG(narg));
  return p;
}